

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractBox(ValueExtractor *this,int *margins,int *paddings,int *spacing)

{
  int iVar1;
  QList<QCss::Declaration> *this_00;
  qsizetype qVar2;
  ValueExtractor *this_01;
  DeclarationData *pDVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  QList<QCss::Declaration> *in_RDI;
  Declaration *decl;
  int i;
  bool hit;
  ulong in_stack_ffffffffffffffb8;
  ValueExtractor *in_stack_ffffffffffffffc0;
  int iVar4;
  uint in_stack_ffffffffffffffdc;
  
  extractFont(in_stack_ffffffffffffffc0);
  in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
  iVar4 = 0;
  do {
    this_00 = (QList<QCss::Declaration> *)(long)iVar4;
    qVar2 = QList<QCss::Declaration>::size(in_RDI);
    if (qVar2 <= (long)this_00) {
      return (bool)((byte)(in_stack_ffffffffffffffdc >> 0x18) & 1);
    }
    this_01 = (ValueExtractor *)QList<QCss::Declaration>::at(this_00,in_stack_ffffffffffffffb8);
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e7ea
                       );
    in_stack_ffffffffffffffb8 = (ulong)(pDVar3->propertyId - Margin);
    switch(in_stack_ffffffffffffffb8) {
    case 0:
      lengthValues((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),
                   (Declaration *)this_01,(int *)in_RDI);
      break;
    case 1:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RSI[2] = iVar1;
      break;
    case 2:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RSI[3] = iVar1;
      break;
    case 3:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RSI[1] = iVar1;
      break;
    case 4:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_RSI = iVar1;
      break;
    default:
      goto LAB_00a2e951;
    case 0x17:
      lengthValues((ValueExtractor *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),
                   (Declaration *)this_01,(int *)in_RDI);
      break;
    case 0x18:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RDX[3] = iVar1;
      break;
    case 0x19:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RDX[1] = iVar1;
      break;
    case 0x1a:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_RDX = iVar1;
      break;
    case 0x1b:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      in_RDX[2] = iVar1;
      break;
    case 0x3b:
      if (in_RCX != (int *)0x0) {
        iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
        *in_RCX = iVar1;
      }
    }
    in_stack_ffffffffffffffdc = CONCAT13(1,(int3)in_stack_ffffffffffffffdc);
LAB_00a2e951:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractBox(int *margins, int *paddings, int *spacing)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case PaddingLeft: paddings[LeftEdge] = lengthValue(decl); break;
        case PaddingRight: paddings[RightEdge] = lengthValue(decl); break;
        case PaddingTop: paddings[TopEdge] = lengthValue(decl); break;
        case PaddingBottom: paddings[BottomEdge] = lengthValue(decl); break;
        case Padding: lengthValues(decl, paddings); break;

        case MarginLeft: margins[LeftEdge] = lengthValue(decl); break;
        case MarginRight: margins[RightEdge] = lengthValue(decl); break;
        case MarginTop: margins[TopEdge] = lengthValue(decl); break;
        case MarginBottom: margins[BottomEdge] = lengthValue(decl); break;
        case Margin: lengthValues(decl, margins); break;
        case QtSpacing: if (spacing) *spacing = lengthValue(decl); break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}